

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qr.c
# Opt level: O0

bool_t qrIsOperable(qr_o *r)

{
  bool_t bVar1;
  ulong *in_RDI;
  void *in_stack_ffffffffffffffe8;
  bool local_9;
  
  bVar1 = objIsOperable(in_stack_ffffffffffffffe8);
  local_9 = false;
  if ((((bVar1 != 0) && (local_9 = false, 0x8f < *in_RDI)) && (local_9 = false, in_RDI[1] == 3)) &&
     (((local_9 = false, in_RDI[2] == 0 && (local_9 = false, in_RDI[6] != 0)) &&
      (local_9 = false, in_RDI[7] != 0)))) {
    bVar1 = memIsValid((void *)in_RDI[4],in_RDI[6] << 3);
    local_9 = false;
    if (((bVar1 != 0) && (local_9 = false, in_RDI[8] != 0)) &&
       (((local_9 = false, in_RDI[9] != 0 &&
         ((((local_9 = false, in_RDI[10] != 0 && (local_9 = false, in_RDI[0xb] != 0)) &&
           (local_9 = false, in_RDI[0xc] != 0)) &&
          ((local_9 = false, in_RDI[0xd] != 0 && (local_9 = false, in_RDI[0xe] != 0)))))) &&
        (local_9 = false, in_RDI[0xf] != 0)))) {
      local_9 = in_RDI[0x10] != 0;
    }
  }
  return (bool_t)local_9;
}

Assistant:

bool_t qrIsOperable(const qr_o* r)
{
	return objIsOperable(r) &&
		objKeep(r) >= sizeof(qr_o) &&
		objPCount(r) == 3 &&
		objOCount(r) == 0 &&
		r->n > 0 && r->no > 0 &&
		wwIsValid(r->unity, r->n) &&
		r->from != 0 &&	
		r->to != 0 &&	
		r->add != 0 &&	
		r->sub != 0 &&	
		r->neg != 0 &&	
		r->mul != 0 &&	
		r->sqr != 0 &&	
		r->inv != 0 &&	
		r->div != 0;
}